

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

void square_set_feat(chunk *c,loc_conflict grid,wchar_t feat)

{
  _Bool _Var1;
  uint uVar2;
  square_conflict *psVar3;
  wchar_t current_feat;
  wchar_t feat_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_in_bounds(c,grid);
  if (_Var1) {
    psVar3 = square(c,grid);
    uVar2 = (uint)psVar3->feat;
    if (uVar2 != 0) {
      c->feat_count[(int)uVar2] = c->feat_count[(int)uVar2] + -1;
    }
    if (feat != L'\0') {
      c->feat_count[feat] = c->feat_count[feat] + 1;
    }
    c_local._4_4_ = grid.y;
    c_local._0_4_ = grid.x;
    c->squares[c_local._4_4_][(wchar_t)c_local].feat = (uint8_t)feat;
    _Var1 = feat_is_bright(feat);
    if (_Var1) {
      psVar3 = square(c,grid);
      flag_on_dbg(psVar3->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
    }
    if ((character_dungeon & 1U) == 0) {
      psVar3 = square(c,grid);
      flag_off(psVar3->info,3,0xb);
      psVar3 = square(c,grid);
      flag_off(psVar3->info,3,0xc);
      psVar3 = square(c,grid);
      flag_off(psVar3->info,3,0xd);
    }
    else {
      _Var1 = square_player_trap_allowed((chunk_conflict2 *)c,grid);
      if (!_Var1) {
        square_destroy_trap(c,grid);
      }
      square_note_spot(c,(loc)grid);
      square_light_spot(c,(loc)grid);
    }
    return;
  }
  __assert_fail("square_in_bounds(c, grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave-square.c"
                ,0x4d9,"void square_set_feat(struct chunk *, struct loc, int)");
}

Assistant:

void square_set_feat(struct chunk *c, struct loc grid, int feat)
{
	int current_feat;

	assert(square_in_bounds(c, grid));
	current_feat = square(c, grid)->feat;

	/* Track changes */
	if (current_feat) c->feat_count[current_feat]--;
	if (feat) c->feat_count[feat]++;

	/* Make the change */
	c->squares[grid.y][grid.x].feat = feat;

	/* Light bright terrain */
	if (feat_is_bright(feat)) {
		sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
	}

	/* Make the new terrain feel at home */
	if (character_dungeon) {
		/* Remove traps if necessary */
		if (!square_player_trap_allowed(c, grid))
			square_destroy_trap(c, grid);

		square_note_spot(c, grid);
		square_light_spot(c, grid);
	} else {
		/* Make sure no incorrect wall flags set for dungeon generation */
		sqinfo_off(square(c, grid)->info, SQUARE_WALL_INNER);
		sqinfo_off(square(c, grid)->info, SQUARE_WALL_OUTER);
		sqinfo_off(square(c, grid)->info, SQUARE_WALL_SOLID);
	}
}